

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O3

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_58;
  int *local_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  int local_20;
  size_t local_18;
  
  if (this->d == 0) {
    if (this->c == 0) {
      if (this->h == 0) {
        if (this->w == 0) {
          Mat::create(&this->data,1,4,(Allocator *)0x0);
          goto LAB_00318744;
        }
        (*mb->_vptr_ModelBin[2])(&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->load_type);
        if (&this->data != (Mat *)&local_58) {
          if (local_50 != (int *)0x0) {
            LOCK();
            *local_50 = *local_50 + 1;
            UNLOCK();
          }
          piVar1 = (this->data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = (this->data).data;
              pAVar3 = (this->data).allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])();
              }
            }
          }
          (this->data).data = local_58;
          (this->data).refcount = local_50;
          (this->data).elemsize = local_48;
          (this->data).elempack = local_40;
          (this->data).allocator = local_38;
          (this->data).dims = local_30;
          (this->data).w = iStack_2c;
          (this->data).h = iStack_28;
          (this->data).d = iStack_24;
          (this->data).c = local_20;
          (this->data).cstep = local_18;
        }
        if (local_50 == (int *)0x0) goto LAB_00318744;
        LOCK();
        *local_50 = *local_50 + -1;
        UNLOCK();
        if (*local_50 != 0) goto LAB_00318744;
        if (local_38 != (Allocator *)0x0) {
          (*local_38->_vptr_Allocator[3])();
          goto LAB_00318744;
        }
      }
      else {
        (*mb->_vptr_ModelBin[3])
                  (&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,
                   (ulong)(uint)this->load_type);
        if (&this->data != (Mat *)&local_58) {
          if (local_50 != (int *)0x0) {
            LOCK();
            *local_50 = *local_50 + 1;
            UNLOCK();
          }
          piVar1 = (this->data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = (this->data).data;
              pAVar3 = (this->data).allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])();
              }
            }
          }
          (this->data).data = local_58;
          (this->data).refcount = local_50;
          (this->data).elemsize = local_48;
          (this->data).elempack = local_40;
          (this->data).allocator = local_38;
          (this->data).dims = local_30;
          (this->data).w = iStack_2c;
          (this->data).h = iStack_28;
          (this->data).d = iStack_24;
          (this->data).c = local_20;
          (this->data).cstep = local_18;
        }
        if (local_50 == (int *)0x0) goto LAB_00318744;
        LOCK();
        *local_50 = *local_50 + -1;
        UNLOCK();
        if (*local_50 != 0) goto LAB_00318744;
        if (local_38 != (Allocator *)0x0) {
          (*local_38->_vptr_Allocator[3])();
          goto LAB_00318744;
        }
      }
    }
    else {
      (*mb->_vptr_ModelBin[4])
                (&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->c,
                 (ulong)(uint)this->load_type);
      if (&this->data != (Mat *)&local_58) {
        if (local_50 != (int *)0x0) {
          LOCK();
          *local_50 = *local_50 + 1;
          UNLOCK();
        }
        piVar1 = (this->data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->data).data;
            pAVar3 = (this->data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->data).data = local_58;
        (this->data).refcount = local_50;
        (this->data).elemsize = local_48;
        (this->data).elempack = local_40;
        (this->data).allocator = local_38;
        (this->data).dims = local_30;
        (this->data).w = iStack_2c;
        (this->data).h = iStack_28;
        (this->data).d = iStack_24;
        (this->data).c = local_20;
        (this->data).cstep = local_18;
      }
      if (local_50 == (int *)0x0) goto LAB_00318744;
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 != 0) goto LAB_00318744;
      if (local_38 != (Allocator *)0x0) {
        (*local_38->_vptr_Allocator[3])();
        goto LAB_00318744;
      }
    }
  }
  else {
    (*mb->_vptr_ModelBin[5])
              (&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->d,
               (ulong)(uint)this->c,this->load_type);
    if (&this->data != (Mat *)&local_58) {
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + 1;
        UNLOCK();
      }
      piVar1 = (this->data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->data).data;
          pAVar3 = (this->data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->data).data = local_58;
      (this->data).refcount = local_50;
      (this->data).elemsize = local_48;
      (this->data).elempack = local_40;
      (this->data).allocator = local_38;
      (this->data).dims = local_30;
      (this->data).w = iStack_2c;
      (this->data).h = iStack_28;
      (this->data).d = iStack_24;
      (this->data).c = local_20;
      (this->data).cstep = local_18;
    }
    if (local_50 == (int *)0x0) goto LAB_00318744;
    LOCK();
    *local_50 = *local_50 + -1;
    UNLOCK();
    if (*local_50 != 0) goto LAB_00318744;
    if (local_38 != (Allocator *)0x0) {
      (*local_38->_vptr_Allocator[3])();
      goto LAB_00318744;
    }
  }
  if (local_58 != (void *)0x0) {
    free(local_58);
  }
LAB_00318744:
  if (((this->data).data == (void *)0x0) ||
     (iVar4 = 0, (long)(this->data).c * (this->data).cstep == 0)) {
    iVar4 = -100;
  }
  return iVar4;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (d != 0)
    {
        data = mb.load(w, h, d, c, load_type);
    }
    else if (c != 0)
    {
        data = mb.load(w, h, c, load_type);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, load_type);
    }
    else if (w != 0)
    {
        data = mb.load(w, load_type);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}